

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_memory_writer::w_raw(xr_memory_writer *this,void *data,size_t size)

{
  size_t sVar1;
  pointer puVar2;
  
  if (size != 0) {
    sVar1 = this->m_pos;
    puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_buffer,sVar1 + size);
      puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar1 = this->m_pos;
    }
    memmove(puVar2 + sVar1,data,size);
    this->m_pos = this->m_pos + size;
  }
  return;
}

Assistant:

void xr_memory_writer::w_raw(const void* data, size_t size)
{
	if (size) {
		if (m_pos + size > m_buffer.size())
			m_buffer.resize(m_pos + size);
		std::memmove(&m_buffer[m_pos], data, size);
		m_pos += size;
	}
}